

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV3MeshWeightsBlock(Parser *this,Mesh *mesh)

{
  bool bVar1;
  uint local_24;
  uint local_20;
  uint iNumBones;
  uint iNumVertices;
  int iDepth;
  Mesh *mesh_local;
  Parser *this_local;
  
  iNumBones = 0;
  local_20 = 0;
  local_24 = 0;
  _iNumVertices = mesh;
  mesh_local = (Mesh *)this;
  do {
    while (*this->filePtr != '*') {
LAB_00631124:
      if (*this->filePtr == '{') {
        iNumBones = iNumBones + 1;
      }
      else if (*this->filePtr == '}') {
        iNumBones = iNumBones - 1;
        if (iNumBones == 0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_WEIGHTS chunk (Level 3)");
      }
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMVERTEX",0xe);
    if (bVar1) {
      ParseLV4MeshLong(this,&local_20);
    }
    else {
      bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMBONE",0xc);
      if (bVar1) {
        ParseLV4MeshLong(this,&local_24);
      }
      else {
        bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_BONE_LIST",0xe);
        if (bVar1) {
          ParseLV4MeshBones(this,local_24,_iNumVertices);
        }
        else {
          bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_BONE_VERTEX_LIST",0x15);
          if (!bVar1) goto LAB_00631124;
          ParseLV4MeshBonesVertices(this,local_20,_iNumVertices);
        }
      }
    }
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshWeightsBlock(ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumVertices = 0, iNumBones = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Number of bone vertices ...
            if (TokenMatch(filePtr,"MESH_NUMVERTEX" ,14))
            {
                ParseLV4MeshLong(iNumVertices);
                continue;
            }
            // Number of bones
            if (TokenMatch(filePtr,"MESH_NUMBONE" ,12))
            {
                ParseLV4MeshLong(iNumBones);
                continue;
            }
            // parse the list of bones
            if (TokenMatch(filePtr,"MESH_BONE_LIST" ,14))
            {
                ParseLV4MeshBones(iNumBones,mesh);
                continue;
            }
            // parse the list of bones vertices
            if (TokenMatch(filePtr,"MESH_BONE_VERTEX_LIST" ,21) )
            {
                ParseLV4MeshBonesVertices(iNumVertices,mesh);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_WEIGHTS");
    }
    return;
}